

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall despot::Parser::Check(Parser *this)

{
  pointer pNVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  OBS_TYPE obs;
  double dVar7;
  double rand;
  vector<int,_std::allocator<int>_> state;
  double local_88;
  vector<int,_std::allocator<int>_> local_80;
  int local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  Print(this,(ostream *)&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"# Terminal states:",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  iVar3 = NumStates(this);
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      ComputeState(&local_80,this,iVar3);
      if (this->has_terminal_ == true) {
        bVar2 = IsInTerminalStateSet(this,&local_80);
        if (!bVar2) {
          bVar2 = IsSelfLoopingWithoutReward(this,&local_80);
          if (!bVar2) goto LAB_0014b80a;
        }
        PrintState(this,&local_80,(ostream *)&std::cout);
      }
LAB_0014b80a:
      if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar3 = iVar3 + 1;
      iVar4 = NumStates(this);
    } while (iVar3 < iVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  iVar3 = 0;
  do {
    local_88 = Random::NextDouble((Random *)&Random::RANDOM);
    ComputeState(&local_80,this,local_88);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s = ",4);
    std::vector<int,_std::allocator<int>_>::vector(&local_48,&local_80);
    poVar5 = despot::operator<<((ostream *)&std::cout,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
    poVar5 = std::ostream::_M_insert<double>(local_88);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    PrintState(this,&local_80,(ostream *)&std::cout);
    iVar4 = 1;
    local_64 = iVar3;
    do {
      pNVar1 = (this->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = Random::NextInt((Random *)&Random::RANDOM,
                              (int)((ulong)((long)*(pointer *)
                                                   ((long)&(pNVar1->super_Variable).values_.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  + 8) -
                                           *(long *)&(pNVar1->super_Variable).values_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a = ",4);
      plVar6 = (long *)std::ostream::operator<<(&std::cout,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      PrintAction(this,iVar3,(ostream *)&std::cout);
      local_88 = Random::NextDouble((Random *)&Random::RANDOM);
      GetNextState(this,&local_80,iVar3,&local_88);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"s\' = ",5);
      std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_80);
      poVar5 = despot::operator<<((ostream *)&std::cout,&local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
      poVar5 = std::ostream::_M_insert<double>(local_88);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      PrintState(this,&local_80,(ostream *)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"r = ",4);
      dVar7 = GetReward(this,iVar3);
      poVar5 = std::ostream::_M_insert<double>(dVar7);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      local_88 = Random::NextDouble((Random *)&Random::RANDOM);
      obs = GetObservation(this,&local_80,iVar3,&local_88);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"o = ",4);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
      poVar5 = std::ostream::_M_insert<double>(local_88);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      dVar7 = ObsProb(this,obs,&local_80,iVar3);
      poVar5 = std::ostream::_M_insert<double>(dVar7);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      PrintObs(this,obs,(ostream *)&std::cout);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      iVar4 = iVar4 + -1;
    } while (iVar4 == 0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"----------------------------------",0x22);
    iVar3 = local_64;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x14);
  exit(0);
}

Assistant:

void Parser::Check() {
	cout << *this << endl;

	cout << "# Terminal states:" << endl;
	for (int s = 0; s < NumStates(); s++) {
		vector<int> state = ComputeState(s);
		if (IsTerminalState(state))
			PrintState(state);
	}
	cout << endl;

	double rand;
	ACT_TYPE action;
	OBS_TYPE obs;
	for (int i = 0; i < 20; i++) {
		rand = Random::RANDOM.NextDouble();
		vector<int> state = ComputeState(rand);
		cout << "s = " << state << " - " << rand << endl;
		PrintState(state);

		for (int j = 0; j < 2; j++) {
			action = Random::RANDOM.NextInt(action_vars_[0].Size());
			cout << "a = " << action << endl;
			PrintAction(action);
			rand = Random::RANDOM.NextDouble();
			GetNextState(state, action, rand);
			cout << "s' = " << state << " - " << rand << endl;
			PrintState(state);
			cout << "r = " << GetReward(action) << endl;
			rand = Random::RANDOM.NextDouble();
			obs = GetObservation(state, action, rand);
			cout << "o = " << obs << " - " << rand << " "
				<< ObsProb(obs, state, action) << endl;
			PrintObs(obs);
			cout << endl;
		}

		cout << "----------------------------------" << endl;
	}
	exit(0);
}